

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

uint * fetchTransformedBilinear<(TextureBlendType)5,(QPixelLayout::BPP)4>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  anon_union_80_2_ea1780ee_for_QSpanData_24 *image;
  ulong uVar1;
  Format FVar2;
  long lVar3;
  QList<unsigned_int> *pQVar4;
  uchar *puVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [13];
  undefined1 auVar24 [15];
  unkuint9 Var25;
  undefined1 auVar26 [11];
  undefined1 auVar27 [13];
  undefined1 auVar28 [14];
  undefined1 auVar29 [12];
  unkuint10 Var30;
  undefined1 auVar31 [14];
  undefined1 auVar32 [12];
  unkuint10 Var33;
  undefined1 auVar34 [14];
  undefined1 auVar35 [12];
  unkbyte10 Var36;
  undefined1 auVar37 [14];
  undefined1 auVar38 [12];
  unkbyte10 Var39;
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [13];
  undefined1 auVar45 [11];
  undefined1 auVar46 [13];
  undefined1 auVar47 [11];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  uint uVar60;
  int iVar61;
  uint uVar62;
  uint uVar63;
  ulong uVar64;
  long lVar65;
  long lVar66;
  int iVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  uint uVar71;
  uint *puVar72;
  uint uVar73;
  uint uVar74;
  int iVar75;
  long in_FS_OFFSET;
  short sVar76;
  short sVar96;
  double dVar77;
  double dVar78;
  undefined1 auVar79 [12];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  byte bVar97;
  undefined1 auVar80 [12];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [12];
  byte bVar112;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  short sVar113;
  short sVar116;
  double dVar114;
  double __x;
  undefined1 auVar115 [16];
  ushort uVar117;
  ushort uVar120;
  double dVar118;
  double dVar119;
  double __x_00;
  undefined1 uVar121;
  undefined1 uVar122;
  undefined1 uVar123;
  undefined1 uVar124;
  undefined1 uVar125;
  undefined1 uVar126;
  undefined1 uVar127;
  undefined1 uVar128;
  double dVar129;
  double dVar130;
  int in_stack_ffffffffffffaf08;
  short local_50c8;
  short sStack_50c6;
  ushort distys [1024];
  ushort distxs [1024];
  uint buf2 [2048];
  uint buf1 [2048];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar83 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  
  uVar68 = (ulong)(uint)length;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  FVar2 = (data->field_23).texture.format;
  pQVar4 = (data->field_23).texture.colorTable;
  dVar130 = (double)x + 0.5;
  dVar118 = (double)y + 0.5;
  if ((data->field_0x8a & 1) != 0) {
    dVar78 = data->m12;
    dVar7 = (dVar118 * data->m21 + dVar130 * data->m11 + data->dx) * 65536.0;
    uVar121 = SUB81(dVar7,0);
    uVar122 = (undefined1)((ulong)dVar7 >> 8);
    uVar123 = (undefined1)((ulong)dVar7 >> 0x10);
    uVar124 = (undefined1)((ulong)dVar7 >> 0x18);
    uVar125 = (undefined1)((ulong)dVar7 >> 0x20);
    uVar126 = (undefined1)((ulong)dVar7 >> 0x28);
    uVar127 = (undefined1)((ulong)dVar7 >> 0x30);
    uVar128 = (undefined1)((ulong)dVar7 >> 0x38);
    dVar129 = (dVar118 * data->m22 + dVar130 * dVar78 + data->dy) * 65536.0;
    dVar119 = dVar129;
    if (dVar7 <= dVar129) {
      dVar119 = dVar7;
    }
    dVar77 = trunc(data->m11 * 65536.0);
    dVar78 = trunc(dVar78 * 65536.0);
    dVar114 = (double)length * dVar77 + dVar7;
    dVar77 = (double)length * dVar78 + dVar129;
    dVar78 = dVar77;
    if (dVar114 <= dVar77) {
      dVar78 = dVar114;
    }
    if (dVar119 <= dVar78) {
      dVar78 = dVar119;
    }
    if (-2147483648.0 <= dVar78) {
      if (dVar129 <= dVar7) {
        dVar129 = dVar7;
      }
      if (dVar77 <= dVar114) {
        dVar77 = dVar114;
      }
      if (dVar77 <= dVar129) {
        dVar77 = dVar129;
      }
      if (dVar77 <= 2147483647.0) {
        uVar60 = (uint)(data->m11 * 65536.0);
        iVar75 = (int)(data->m12 * 65536.0);
        image = &data->field_23;
        distxs._0_4_ = (int)((data->m21 * dVar118 + dVar130 * data->m11 + data->dx) * 65536.0) +
                       -0x8000;
        uVar71 = (int)((dVar118 * data->m22 + dVar130 * data->m12 + data->dy) * 65536.0) - 0x8000;
        distys._0_4_ = uVar71;
        uVar73 = uVar71;
        if (iVar75 != 0) {
          puVar72 = buffer;
          if (length != 0) {
            do {
              iVar61 = (int)uVar68;
              uVar64 = 0x400;
              if (iVar61 < 0x400) {
                uVar64 = uVar68;
              }
              iVar67 = (int)uVar64;
              fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)4,unsigned_int>
                        (buf1,buf2,iVar67,&image->texture,distxs._0_4_,uVar71,uVar60,iVar75);
              (*qPixelLayouts[FVar2].convertToARGB32PM)(buf1,iVar67 * 2,pQVar4);
              (*qPixelLayouts[FVar2].convertToARGB32PM)(buf2,iVar67 * 2,pQVar4);
              if (0 < iVar61) {
                uVar68 = 0;
                do {
                  uVar73 = (uint)distxs._0_4_ >> 8 & 0xff;
                  uVar70 = *(ulong *)(buf1 + uVar68 * 2);
                  uVar1 = *(ulong *)(buf2 + uVar68 * 2);
                  auVar9._8_6_ = 0;
                  auVar9._0_8_ = uVar70;
                  auVar9[0xe] = (char)(uVar70 >> 0x38);
                  auVar11._8_4_ = 0;
                  auVar11._0_8_ = uVar70;
                  auVar11[0xc] = (char)(uVar70 >> 0x30);
                  auVar11._13_2_ = auVar9._13_2_;
                  auVar13._8_4_ = 0;
                  auVar13._0_8_ = uVar70;
                  auVar13._12_3_ = auVar11._12_3_;
                  auVar15._8_2_ = 0;
                  auVar15._0_8_ = uVar70;
                  auVar15[10] = (char)(uVar70 >> 0x28);
                  auVar15._11_4_ = auVar13._11_4_;
                  auVar17._8_2_ = 0;
                  auVar17._0_8_ = uVar70;
                  auVar17._10_5_ = auVar15._10_5_;
                  auVar19[8] = (char)(uVar70 >> 0x20);
                  auVar19._0_8_ = uVar70;
                  auVar19._9_6_ = auVar17._9_6_;
                  auVar20._7_8_ = 0;
                  auVar20._0_7_ = auVar19._8_7_;
                  Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),(char)(uVar70 >> 0x18));
                  auVar40._9_6_ = 0;
                  auVar40._0_9_ = Var21;
                  auVar22._1_10_ = SUB1510(auVar40 << 0x30,5);
                  auVar22[0] = (char)(uVar70 >> 0x10);
                  auVar41._11_4_ = 0;
                  auVar41._0_11_ = auVar22;
                  auVar23._1_12_ = SUB1512(auVar41 << 0x20,3);
                  auVar23[0] = (char)(uVar70 >> 8);
                  auVar8._8_6_ = 0;
                  auVar8._0_8_ = uVar1;
                  auVar8[0xe] = (char)(uVar1 >> 0x38);
                  auVar10._8_4_ = 0;
                  auVar10._0_8_ = uVar1;
                  auVar10[0xc] = (char)(uVar1 >> 0x30);
                  auVar10._13_2_ = auVar8._13_2_;
                  auVar12._8_4_ = 0;
                  auVar12._0_8_ = uVar1;
                  auVar12._12_3_ = auVar10._12_3_;
                  auVar14._8_2_ = 0;
                  auVar14._0_8_ = uVar1;
                  auVar14[10] = (char)(uVar1 >> 0x28);
                  auVar14._11_4_ = auVar12._11_4_;
                  auVar16._8_2_ = 0;
                  auVar16._0_8_ = uVar1;
                  auVar16._10_5_ = auVar14._10_5_;
                  auVar18[8] = (char)(uVar1 >> 0x20);
                  auVar18._0_8_ = uVar1;
                  auVar18._9_6_ = auVar16._9_6_;
                  auVar24._7_8_ = 0;
                  auVar24._0_7_ = auVar18._8_7_;
                  Var25 = CONCAT81(SUB158(auVar24 << 0x40,7),(char)(uVar1 >> 0x18));
                  auVar42._9_6_ = 0;
                  auVar42._0_9_ = Var25;
                  auVar26._1_10_ = SUB1510(auVar42 << 0x30,5);
                  auVar26[0] = (char)(uVar1 >> 0x10);
                  auVar43._11_4_ = 0;
                  auVar43._0_11_ = auVar26;
                  auVar27._1_12_ = SUB1512(auVar43 << 0x20,3);
                  auVar27[0] = (char)(uVar1 >> 8);
                  uVar74 = uVar71 >> 8 & 0xff;
                  auVar115 = pshuflw(ZEXT416(0x100 - uVar74),ZEXT416(0x100 - uVar74),0);
                  sVar113 = auVar115._0_2_;
                  sVar116 = auVar115._2_2_;
                  auVar115 = pshuflw(ZEXT416(uVar74),ZEXT416(uVar74),0);
                  sVar76 = auVar115._0_2_;
                  sVar96 = auVar115._2_2_;
                  auVar87._0_4_ =
                       CONCAT22(sVar96 * auVar27._0_2_ + sVar116 * auVar23._0_2_,
                                sVar76 * (ushort)(byte)uVar1 + sVar113 * (ushort)(byte)uVar70);
                  auVar79._0_8_ =
                       CONCAT26(sVar96 * (short)Var25 + sVar116 * (short)Var21,
                                CONCAT24(sVar76 * auVar26._0_2_ + sVar113 * auVar22._0_2_,
                                         auVar87._0_4_));
                  auVar79._8_2_ = sVar76 * auVar18._8_2_ + sVar113 * auVar19._8_2_;
                  auVar79._10_2_ = sVar96 * auVar14._10_2_ + sVar116 * auVar15._10_2_;
                  auVar115._12_2_ = sVar76 * auVar10._12_2_ + sVar113 * auVar11._12_2_;
                  auVar115._0_12_ = auVar79;
                  auVar115._14_2_ = sVar96 * (auVar8._13_2_ >> 8) + sVar116 * (auVar9._13_2_ >> 8);
                  auVar99._0_4_ = CONCAT22((short)uVar73,(short)(0x100 - uVar73));
                  auVar99._4_4_ = auVar99._0_4_;
                  auVar99._8_4_ = auVar99._0_4_;
                  auVar99._12_4_ = auVar99._0_4_;
                  auVar87._12_4_ = auVar115._12_4_;
                  auVar87._4_4_ = auVar79._8_4_;
                  auVar87._8_4_ = (int)((ulong)auVar79._0_8_ >> 0x20);
                  auVar115 = pshuflw(auVar87,auVar87,0xd8);
                  auVar115 = pshufhw(auVar115,auVar115,0xd8);
                  auVar81._0_2_ = auVar115._0_2_ >> 8;
                  auVar81._2_2_ = auVar115._2_2_ >> 8;
                  auVar81._4_2_ = auVar115._4_2_ >> 8;
                  auVar81._6_2_ = auVar115._6_2_ >> 8;
                  auVar81._8_2_ = auVar115._8_2_ >> 8;
                  auVar81._10_2_ = auVar115._10_2_ >> 8;
                  auVar81._12_2_ = auVar115._12_2_ >> 8;
                  auVar81._14_2_ = auVar115._14_2_ >> 8;
                  auVar115 = pmaddwd(auVar81,auVar99);
                  auVar82._0_4_ = auVar115._0_4_ >> 8;
                  auVar82._4_4_ = auVar115._4_4_ >> 8;
                  auVar82._8_4_ = auVar115._8_4_ >> 8;
                  auVar82._12_4_ = auVar115._12_4_ >> 8;
                  auVar115 = packssdw(auVar82,auVar82);
                  sVar76 = auVar115._0_2_;
                  sVar96 = auVar115._2_2_;
                  sVar113 = auVar115._4_2_;
                  sVar116 = auVar115._6_2_;
                  puVar72[uVar68] =
                       CONCAT13((0 < sVar116) * (sVar116 < 0x100) * auVar115[6] - (0xff < sVar116),
                                CONCAT12((0 < sVar113) * (sVar113 < 0x100) * auVar115[4] -
                                         (0xff < sVar113),
                                         CONCAT11((0 < sVar96) * (sVar96 < 0x100) * auVar115[2] -
                                                  (0xff < sVar96),
                                                  (0 < sVar76) * (sVar76 < 0x100) * auVar115[0] -
                                                  (0xff < sVar76))));
                  distxs._0_4_ = distxs._0_4_ + uVar60;
                  uVar71 = uVar71 + iVar75;
                  uVar68 = uVar68 + 1;
                } while (uVar64 != uVar68);
              }
              uVar68 = (ulong)(uint)(iVar61 - iVar67);
              puVar72 = puVar72 + iVar67;
              uVar73 = uVar71;
            } while (iVar61 - iVar67 != 0);
          }
          goto LAB_0066d45a;
        }
        uVar74 = -uVar60;
        if (0 < (int)uVar60) {
          uVar74 = uVar60;
        }
        puVar72 = buffer;
        if (0x10000 < uVar74) {
          if (0x20000 < uVar74) {
            if (length != 0) {
              auVar115 = ZEXT416(0x100 - (uVar71 >> 8 & 0xff));
              auVar115 = pshuflw(auVar115,auVar115,0);
              auVar87 = pshuflw(ZEXT416(uVar71),ZEXT416(uVar71),0);
              uVar117 = auVar87._0_2_;
              uVar120 = auVar87._2_2_;
              do {
                iVar75 = (int)uVar68;
                uVar64 = 0x400;
                if (iVar75 < 0x400) {
                  uVar64 = uVar68;
                }
                iVar61 = (int)uVar64;
                fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)4,unsigned_int>
                          (buf1,buf2,iVar61,&image->texture,distxs._0_4_,uVar71,uVar60,0);
                (*qPixelLayouts[FVar2].convertToARGB32PM)(buf1,iVar61 * 2,pQVar4);
                (*qPixelLayouts[FVar2].convertToARGB32PM)(buf2,iVar61 * 2,pQVar4);
                if (0 < iVar75) {
                  uVar70 = 0;
                  local_50c8 = auVar115._0_2_;
                  sStack_50c6 = auVar115._2_2_;
                  uVar68 = CONCAT17(uVar128,CONCAT16(uVar127,CONCAT15(uVar126,CONCAT14(uVar125,
                                                  CONCAT13(uVar124,CONCAT12(uVar123,CONCAT11(uVar122
                                                  ,uVar121))))))) ^
                           CONCAT17(uVar128,CONCAT16(uVar127,CONCAT15(uVar126,CONCAT14(uVar125,
                                                  CONCAT13(uVar124,CONCAT12(uVar123,CONCAT11(uVar122
                                                  ,uVar121)))))));
                  uVar121 = (undefined1)uVar68;
                  uVar122 = (undefined1)(uVar68 >> 8);
                  uVar123 = (undefined1)(uVar68 >> 0x10);
                  uVar124 = (undefined1)(uVar68 >> 0x18);
                  uVar125 = (undefined1)(uVar68 >> 0x20);
                  uVar126 = (undefined1)(uVar68 >> 0x28);
                  uVar127 = (undefined1)(uVar68 >> 0x30);
                  uVar128 = (undefined1)(uVar68 >> 0x38);
                  do {
                    uVar73 = (uint)distxs._0_4_ >> 8 & 0xff;
                    uVar68 = *(ulong *)(buf1 + uVar70 * 2);
                    uVar1 = *(ulong *)(buf2 + uVar70 * 2);
                    auVar94._8_6_ = 0;
                    auVar94._0_8_ = uVar68;
                    auVar94[0xe] = (char)(uVar68 >> 0x38);
                    auVar94[0xf] = uVar128;
                    auVar93._14_2_ = auVar94._14_2_;
                    auVar93._8_5_ = 0;
                    auVar93._0_8_ = uVar68;
                    auVar93[0xd] = uVar127;
                    auVar92._13_3_ = auVar93._13_3_;
                    auVar92._8_4_ = 0;
                    auVar92._0_8_ = uVar68;
                    auVar92[0xc] = (char)(uVar68 >> 0x30);
                    auVar91._12_4_ = auVar92._12_4_;
                    auVar91._8_3_ = 0;
                    auVar91._0_8_ = uVar68;
                    auVar91[0xb] = uVar126;
                    auVar90._11_5_ = auVar91._11_5_;
                    auVar90._8_2_ = 0;
                    auVar90._0_8_ = uVar68;
                    auVar90[10] = (char)(uVar68 >> 0x28);
                    auVar89._10_6_ = auVar90._10_6_;
                    auVar89[8] = 0;
                    auVar89._0_8_ = uVar68;
                    auVar89[9] = uVar125;
                    auVar88._9_7_ = auVar89._9_7_;
                    auVar88[8] = (char)(uVar68 >> 0x20);
                    auVar88._0_8_ = uVar68;
                    Var36 = CONCAT91(CONCAT81(auVar88._8_8_,uVar124),(char)(uVar68 >> 0x18));
                    auVar35._2_10_ = Var36;
                    auVar35[1] = uVar123;
                    auVar35[0] = (char)(uVar68 >> 0x10);
                    auVar34._2_12_ = auVar35;
                    auVar34[1] = uVar122;
                    auVar34[0] = (char)(uVar68 >> 8);
                    auVar107._8_6_ = 0;
                    auVar107._0_8_ = uVar1;
                    auVar107[0xe] = (char)(uVar1 >> 0x38);
                    auVar107[0xf] = uVar128;
                    auVar106._14_2_ = auVar107._14_2_;
                    auVar106._8_5_ = 0;
                    auVar106._0_8_ = uVar1;
                    auVar106[0xd] = uVar127;
                    auVar105._13_3_ = auVar106._13_3_;
                    auVar105._8_4_ = 0;
                    auVar105._0_8_ = uVar1;
                    auVar105[0xc] = (char)(uVar1 >> 0x30);
                    auVar104._12_4_ = auVar105._12_4_;
                    auVar104._8_3_ = 0;
                    auVar104._0_8_ = uVar1;
                    auVar104[0xb] = uVar126;
                    auVar103._11_5_ = auVar104._11_5_;
                    auVar103._8_2_ = 0;
                    auVar103._0_8_ = uVar1;
                    auVar103[10] = (char)(uVar1 >> 0x28);
                    auVar102._10_6_ = auVar103._10_6_;
                    auVar102[8] = 0;
                    auVar102._0_8_ = uVar1;
                    auVar102[9] = uVar125;
                    auVar101._9_7_ = auVar102._9_7_;
                    auVar101[8] = (char)(uVar1 >> 0x20);
                    auVar101._0_8_ = uVar1;
                    Var39 = CONCAT91(CONCAT81(auVar101._8_8_,uVar124),(char)(uVar1 >> 0x18));
                    auVar38._2_10_ = Var39;
                    auVar38[1] = uVar123;
                    auVar38[0] = (char)(uVar1 >> 0x10);
                    auVar37._2_12_ = auVar38;
                    auVar37[1] = uVar122;
                    auVar37[0] = (char)(uVar1 >> 8);
                    auVar109._0_4_ =
                         CONCAT22(auVar37._0_2_ * (uVar120 >> 8) + auVar34._0_2_ * sStack_50c6,
                                  CONCAT11(uVar121,(char)uVar1) * (uVar117 >> 8) +
                                  CONCAT11(uVar121,(char)uVar68) * local_50c8);
                    auVar98._0_8_ =
                         CONCAT26((short)Var39 * (uVar120 >> 8) + (short)Var36 * sStack_50c6,
                                  CONCAT24(auVar38._0_2_ * (uVar117 >> 8) +
                                           auVar35._0_2_ * local_50c8,auVar109._0_4_));
                    auVar98._8_2_ = auVar101._8_2_ * (uVar117 >> 8) + auVar88._8_2_ * local_50c8;
                    auVar98._10_2_ = auVar103._10_2_ * (uVar120 >> 8) + auVar90._10_2_ * sStack_50c6
                    ;
                    auVar108._12_2_ = auVar105._12_2_ * (uVar117 >> 8) + auVar92._12_2_ * local_50c8
                    ;
                    auVar108._0_12_ = auVar98;
                    auVar108._14_2_ =
                         auVar106._14_2_ * (uVar120 >> 8) + auVar93._14_2_ * sStack_50c6;
                    auVar95._0_4_ = CONCAT22((short)uVar73,(short)(0x100 - uVar73));
                    auVar95._4_4_ = auVar95._0_4_;
                    auVar95._8_4_ = auVar95._0_4_;
                    auVar95._12_4_ = auVar95._0_4_;
                    auVar109._12_4_ = auVar108._12_4_;
                    auVar109._4_4_ = auVar98._8_4_;
                    auVar109._8_4_ = (int)((ulong)auVar98._0_8_ >> 0x20);
                    auVar87 = pshuflw(auVar109,auVar109,0xd8);
                    auVar87 = pshufhw(auVar87,auVar87,0xd8);
                    auVar110._0_2_ = auVar87._0_2_ >> 8;
                    auVar110._2_2_ = auVar87._2_2_ >> 8;
                    auVar110._4_2_ = auVar87._4_2_ >> 8;
                    auVar110._6_2_ = auVar87._6_2_ >> 8;
                    auVar110._8_2_ = auVar87._8_2_ >> 8;
                    auVar110._10_2_ = auVar87._10_2_ >> 8;
                    auVar110._12_2_ = auVar87._12_2_ >> 8;
                    auVar110._14_2_ = auVar87._14_2_ >> 8;
                    auVar87 = pmaddwd(auVar110,auVar95);
                    auVar111._0_4_ = auVar87._0_4_ >> 8;
                    auVar111._4_4_ = auVar87._4_4_ >> 8;
                    auVar111._8_4_ = auVar87._8_4_ >> 8;
                    auVar111._12_4_ = auVar87._12_4_ >> 8;
                    auVar87 = packssdw(auVar111,auVar111);
                    sVar76 = auVar87._0_2_;
                    sVar96 = auVar87._2_2_;
                    sVar113 = auVar87._4_2_;
                    sVar116 = auVar87._6_2_;
                    puVar72[uVar70] =
                         CONCAT13((0 < sVar116) * (sVar116 < 0x100) * auVar87[6] - (0xff < sVar116),
                                  CONCAT12((0 < sVar113) * (sVar113 < 0x100) * auVar87[4] -
                                           (0xff < sVar113),
                                           CONCAT11((0 < sVar96) * (sVar96 < 0x100) * auVar87[2] -
                                                    (0xff < sVar96),
                                                    (0 < sVar76) * (sVar76 < 0x100) * auVar87[0] -
                                                    (0xff < sVar76))));
                    distxs._0_4_ = distxs._0_4_ + uVar60;
                    uVar70 = uVar70 + 1;
                  } while (uVar64 != uVar70);
                }
                puVar72 = puVar72 + iVar61;
                uVar68 = (ulong)(uint)(iVar75 - iVar61);
                uVar73 = distys._0_4_;
              } while (iVar75 - iVar61 != 0);
            }
            goto LAB_0066d45a;
          }
          uVar71 = length + 1U >> 1;
          if (length < 0x400) {
            uVar71 = length;
          }
          fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                    (buffer,buffer + (int)uVar71,&image->texture,(int *)distxs,(int *)distys,uVar60,
                     in_stack_ffffffffffffaf08);
          puVar72 = buffer + (int)uVar71;
          uVar73 = distys._0_4_;
          if (uVar71 == length) goto LAB_0066d45a;
        }
        fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                  (puVar72,buffer + length,&image->texture,(int *)distxs,(int *)distys,uVar60,
                   in_stack_ffffffffffffaf08);
        uVar73 = distys._0_4_;
        goto LAB_0066d45a;
      }
    }
  }
  uVar73 = distys._0_4_;
  if (length != 0) {
    dVar7 = data->m13;
    dVar78 = data->m11;
    dVar129 = data->m12;
    dVar77 = data->m23 * dVar118 + dVar130 * dVar7 + data->m33;
    dVar119 = dVar118 * data->m21 + dVar130 * dVar78 + data->dx;
    dVar118 = dVar118 * data->m22 + dVar130 * dVar129 + data->dy;
    puVar72 = buffer;
    do {
      iVar75 = (int)uVar68;
      uVar64 = 0x400;
      if (iVar75 < 0x400) {
        uVar64 = uVar68;
      }
      if (0 < iVar75) {
        puVar5 = (data->field_23).texture.imageData;
        lVar6 = (data->field_23).texture.bytesPerLine;
        uVar73 = (data->field_23).texture.width;
        uVar60 = (data->field_23).texture.height;
        uVar68 = 0;
        do {
          dVar130 = (double)(-(ulong)(dVar77 == 0.0) & 0x40d0000000000000 |
                            ~-(ulong)(dVar77 == 0.0) & (ulong)(1.0 / dVar77));
          __x = dVar119 * dVar130 + -0.5;
          __x_00 = dVar118 * dVar130 + -0.5;
          dVar130 = floor(__x);
          dVar114 = floor(__x_00);
          distxs[uVar68] = (ushort)(int)((__x - (double)(int)dVar130) * 65536.0);
          distys[uVar68] = (ushort)(int)((__x_00 - (double)(int)dVar114) * 65536.0);
          iVar61 = (int)dVar130 % (int)uVar73;
          uVar71 = iVar61 >> 0x1f & uVar73;
          uVar74 = uVar71 + iVar61 + 1;
          if (uVar74 == uVar73) {
            uVar74 = 0;
          }
          iVar67 = (int)dVar114 % (int)uVar60;
          uVar62 = iVar67 >> 0x1f & uVar60;
          uVar63 = uVar62 + iVar67 + 1;
          if (uVar63 == uVar60) {
            uVar63 = 0;
          }
          lVar66 = (int)(uVar62 + iVar67) * lVar6;
          lVar65 = (int)uVar63 * lVar6;
          lVar69 = (long)(int)(uVar71 + iVar61);
          buf1[uVar68 * 2] = (uint)*(ushort *)(puVar5 + lVar69 * 2 + lVar66);
          buf1[uVar68 * 2 + 1] = (uint)*(ushort *)(puVar5 + (long)(int)uVar74 * 2 + lVar66);
          buf2[uVar68 * 2] = (uint)*(ushort *)(puVar5 + lVar69 * 2 + lVar65);
          buf2[uVar68 * 2 + 1] = (uint)*(ushort *)(puVar5 + (long)(int)uVar74 * 2 + lVar65);
          dVar119 = dVar119 + dVar78;
          dVar118 = dVar118 + dVar129;
          dVar77 = dVar77 + dVar7;
          uVar68 = uVar68 + 1;
        } while (uVar64 != uVar68);
      }
      iVar61 = (int)uVar64;
      (*qPixelLayouts[FVar2].convertToARGB32PM)(buf1,iVar61 * 2,pQVar4);
      (*qPixelLayouts[FVar2].convertToARGB32PM)(buf2,iVar61 * 2,pQVar4);
      if (0 < iVar75) {
        uVar68 = 0;
        do {
          uVar70 = *(ulong *)(buf1 + uVar68 * 2);
          uVar1 = *(ulong *)(buf2 + uVar68 * 2);
          bVar97 = (byte)(uVar70 >> 0x38);
          auVar48._8_6_ = 0;
          auVar48._0_8_ = uVar70;
          auVar48[0xe] = bVar97;
          auVar50._8_4_ = 0;
          auVar50._0_8_ = uVar70;
          auVar50[0xc] = (char)(uVar70 >> 0x30);
          auVar50._13_2_ = auVar48._13_2_;
          auVar52._8_4_ = 0;
          auVar52._0_8_ = uVar70;
          auVar52._12_3_ = auVar50._12_3_;
          auVar54._8_2_ = 0;
          auVar54._0_8_ = uVar70;
          auVar54[10] = (char)(uVar70 >> 0x28);
          auVar54._11_4_ = auVar52._11_4_;
          auVar56._8_2_ = 0;
          auVar56._0_8_ = uVar70;
          auVar56._10_5_ = auVar54._10_5_;
          auVar58[8] = (char)(uVar70 >> 0x20);
          auVar58._0_8_ = uVar70;
          auVar58._9_6_ = auVar56._9_6_;
          Var30 = CONCAT91((unkuint9)auVar58._8_7_ << 8,(char)(uVar70 >> 0x18));
          auVar45[10] = 0;
          auVar45._0_10_ = Var30;
          auVar29._1_11_ = auVar45 << 8;
          auVar29[0] = (char)(uVar70 >> 0x10);
          auVar44[0xc] = 0;
          auVar44._0_12_ = auVar29;
          auVar28._1_13_ = auVar44 << 8;
          auVar28[0] = (char)(uVar70 >> 8);
          bVar112 = (byte)(uVar1 >> 0x38);
          auVar49._8_6_ = 0;
          auVar49._0_8_ = uVar1;
          auVar49[0xe] = bVar112;
          auVar51._8_4_ = 0;
          auVar51._0_8_ = uVar1;
          auVar51[0xc] = (char)(uVar1 >> 0x30);
          auVar51._13_2_ = auVar49._13_2_;
          auVar53._8_4_ = 0;
          auVar53._0_8_ = uVar1;
          auVar53._12_3_ = auVar51._12_3_;
          auVar55._8_2_ = 0;
          auVar55._0_8_ = uVar1;
          auVar55[10] = (char)(uVar1 >> 0x28);
          auVar55._11_4_ = auVar53._11_4_;
          auVar57._8_2_ = 0;
          auVar57._0_8_ = uVar1;
          auVar57._10_5_ = auVar55._10_5_;
          auVar59[8] = (char)(uVar1 >> 0x20);
          auVar59._0_8_ = uVar1;
          auVar59._9_6_ = auVar57._9_6_;
          Var33 = CONCAT91((unkuint9)auVar59._8_7_ << 8,(char)(uVar1 >> 0x18));
          auVar47[10] = 0;
          auVar47._0_10_ = Var33;
          auVar32._1_11_ = auVar47 << 8;
          auVar32[0] = (char)(uVar1 >> 0x10);
          auVar46[0xc] = 0;
          auVar46._0_12_ = auVar32;
          auVar31._1_13_ = auVar46 << 8;
          auVar31[0] = (char)(uVar1 >> 8);
          uVar73 = (uint)*(byte *)((long)distys + uVar68 * 2 + 1);
          auVar115 = pshuflw(ZEXT416(0x100 - uVar73),ZEXT416(0x100 - uVar73),0);
          sVar113 = auVar115._0_2_;
          sVar116 = auVar115._2_2_;
          auVar115 = pshuflw(ZEXT416(uVar73),ZEXT416(uVar73),0);
          sVar76 = auVar115._0_2_;
          sVar96 = auVar115._2_2_;
          auVar84._0_4_ =
               CONCAT22(sVar96 * auVar31._0_2_ + sVar116 * auVar28._0_2_,
                        sVar76 * (ushort)(byte)uVar1 + sVar113 * (ushort)(byte)uVar70);
          auVar80._0_8_ =
               CONCAT26(sVar96 * (short)Var33 + sVar116 * (short)Var30,
                        CONCAT24(sVar76 * auVar32._0_2_ + sVar113 * auVar29._0_2_,auVar84._0_4_));
          auVar80._8_2_ = sVar76 * auVar59._8_2_ + sVar113 * auVar58._8_2_;
          auVar80._10_2_ = sVar96 * auVar55._10_2_ + sVar116 * auVar54._10_2_;
          auVar83._12_2_ = sVar76 * auVar51._12_2_ + sVar113 * auVar50._12_2_;
          auVar83._0_12_ = auVar80;
          auVar83._14_2_ = sVar96 * (ushort)bVar112 + sVar116 * (ushort)bVar97;
          auVar100._0_4_ = CONCAT22(distxs[uVar68] >> 8,0x100 - (distxs[uVar68] >> 8));
          auVar100._4_4_ = auVar100._0_4_;
          auVar100._8_4_ = auVar100._0_4_;
          auVar100._12_4_ = auVar100._0_4_;
          auVar84._12_4_ = auVar83._12_4_;
          auVar84._4_4_ = auVar80._8_4_;
          auVar84._8_4_ = (int)((ulong)auVar80._0_8_ >> 0x20);
          auVar115 = pshuflw(auVar84,auVar84,0xd8);
          auVar115 = pshufhw(auVar115,auVar115,0xd8);
          auVar85._0_2_ = auVar115._0_2_ >> 8;
          auVar85._2_2_ = auVar115._2_2_ >> 8;
          auVar85._4_2_ = auVar115._4_2_ >> 8;
          auVar85._6_2_ = auVar115._6_2_ >> 8;
          auVar85._8_2_ = auVar115._8_2_ >> 8;
          auVar85._10_2_ = auVar115._10_2_ >> 8;
          auVar85._12_2_ = auVar115._12_2_ >> 8;
          auVar85._14_2_ = auVar115._14_2_ >> 8;
          auVar115 = pmaddwd(auVar85,auVar100);
          auVar86._0_4_ = auVar115._0_4_ >> 8;
          auVar86._4_4_ = auVar115._4_4_ >> 8;
          auVar86._8_4_ = auVar115._8_4_ >> 8;
          auVar86._12_4_ = auVar115._12_4_ >> 8;
          auVar115 = packssdw(auVar86,auVar86);
          sVar76 = auVar115._0_2_;
          sVar96 = auVar115._2_2_;
          sVar113 = auVar115._4_2_;
          sVar116 = auVar115._6_2_;
          puVar72[uVar68] =
               CONCAT13((0 < sVar116) * (sVar116 < 0x100) * auVar115[6] - (0xff < sVar116),
                        CONCAT12((0 < sVar113) * (sVar113 < 0x100) * auVar115[4] - (0xff < sVar113),
                                 CONCAT11((0 < sVar96) * (sVar96 < 0x100) * auVar115[2] -
                                          (0xff < sVar96),
                                          (0 < sVar76) * (sVar76 < 0x100) * auVar115[0] -
                                          (0xff < sVar76))));
          uVar68 = uVar68 + 1;
        } while (uVar64 != uVar68);
      }
      puVar72 = puVar72 + iVar61;
      uVar68 = (ulong)(uint)(iVar75 - iVar61);
      uVar73 = distys._0_4_;
    } while (iVar75 - iVar61 != 0);
  }
LAB_0066d45a:
  distys._0_4_ = uVar73;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return buffer;
}

Assistant:

static const uint *QT_FASTCALL fetchTransformedBilinear(uint *buffer, const Operator *,
                                                        const QSpanData *data, int y, int x, int length)
{
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    const QList<QRgb> *clut = data->texture.colorTable;
    Q_ASSERT(bpp == QPixelLayout::BPPNone || layout->bpp == bpp);

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) { // scale up on X
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) { // scale down on X less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    fetchTransformedBilinear_simple_scale_helper<blendType>(buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else {
                const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

                Q_DECL_UNINITIALIZED uint buf1[BufferSize];
                Q_DECL_UNINITIALIZED uint buf2[BufferSize];
                uint *b = buffer;
                while (length) {
                    int len = qMin(length, BufferSize / 2);
                    fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, 0);
                    layout->convertToARGB32PM(buf1, len * 2, clut);
                    layout->convertToARGB32PM(buf2, len * 2, clut);

                    if (hasFastInterpolate4() || qAbs(data->m22) < qreal(1./8.)) { // scale up more than 8x (on Y)
                        int disty = (fy & 0x0000ffff) >> 8;
                        for (int i = 0; i < len; ++i) {
                            int distx = (fx & 0x0000ffff) >> 8;
                            b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                            fx += fdx;
                        }
                    } else {
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
                        for (int i = 0; i < len; ++i) {
                            uint tl = buf1[i * 2 + 0];
                            uint tr = buf1[i * 2 + 1];
                            uint bl = buf2[i * 2 + 0];
                            uint br = buf2[i * 2 + 1];
                            int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                            b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                            fx += fdx;
                        }
                    }
                    length -= len;
                    b += len;
                }
            }
        } else { // rotation or shear
            const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

            Q_DECL_UNINITIALIZED uint buf1[BufferSize];
            Q_DECL_UNINITIALIZED uint buf2[BufferSize];
            uint *b = buffer;
            while (length) {
                int len = qMin(length, BufferSize / 2);
                fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, fdy);
                layout->convertToARGB32PM(buf1, len * 2, clut);
                layout->convertToARGB32PM(buf2, len * 2, clut);

                if (hasFastInterpolate4() || qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.)) {
                    // If we are zooming more than 8 times, we use 8bit precision for the position.
                    for (int i = 0; i < len; ++i) {
                        int distx = (fx & 0x0000ffff) >> 8;
                        int disty = (fy & 0x0000ffff) >> 8;

                        b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                } else {
                    // We are zooming less than 8x, use 4bit precision
                    for (int i = 0; i < len; ++i) {
                        uint tl = buf1[i * 2 + 0];
                        uint tr = buf1[i * 2 + 1];
                        uint bl = buf2[i * 2 + 0];
                        uint br = buf2[i * 2 + 1];

                        int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;

                        b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                }

                length -= len;
                b += len;
            }
        }
    } else {
        const auto fetcher = fetchTransformedBilinear_slow_fetcher<blendType,bpp,uint>;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        Q_DECL_UNINITIALIZED uint buf1[BufferSize];
        Q_DECL_UNINITIALIZED uint buf2[BufferSize];
        uint *b = buffer;

        Q_DECL_UNINITIALIZED ushort distxs[BufferSize / 2];
        Q_DECL_UNINITIALIZED ushort distys[BufferSize / 2];

        while (length) {
            const int len = qMin(length, BufferSize / 2);
            fetcher(buf1, buf2, distxs, distys, len, data->texture, fx, fy, fw, fdx, fdy, fdw);

            layout->convertToARGB32PM(buf1, len * 2, clut);
            layout->convertToARGB32PM(buf2, len * 2, clut);

            for (int i = 0; i < len; ++i) {
                const int distx = distxs[i] >> 8;
                const int disty = distys[i] >> 8;

                b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
            }
            length -= len;
            b += len;
        }
    }

    return buffer;
}